

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

wstring * NJamSpell::UTF8ToWide(wstring *__return_storage_ptr__,string *text)

{
  char *__first;
  undefined1 local_80 [8];
  wstring_convert<std::codecvt_utf8_utf16<wchar_t,_1114111UL,_(std::codecvt_mode)1>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  converter;
  
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<wchar_t,_1114111UL,_(std::codecvt_mode)1>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::wstring_convert((wstring_convert<std::codecvt_utf8_utf16<wchar_t,_1114111UL,_(std::codecvt_mode)1>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                     *)local_80);
  __first = (text->_M_dataplus)._M_p;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<wchar_t,_1114111UL,_(std::codecvt_mode)1>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::from_bytes(__return_storage_ptr__,
               (wstring_convert<std::codecvt_utf8_utf16<wchar_t,_1114111UL,_(std::codecvt_mode)1>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                *)local_80,__first,__first + text->_M_string_length);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<wchar_t,_1114111UL,_(std::codecvt_mode)1>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::~wstring_convert((wstring_convert<std::codecvt_utf8_utf16<wchar_t,_1114111UL,_(std::codecvt_mode)1>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                      *)local_80);
  return __return_storage_ptr__;
}

Assistant:

std::wstring UTF8ToWide(const std::string& text) {
#ifdef USE_BOOST_CONVERT
    using boost::locale::conv::utf_to_utf;
    return utf_to_utf<wchar_t>(text.c_str(), text.c_str() + text.size());
#else
    std::wstring_convert<std::codecvt_utf8_utf16<wchar_t, 0x10ffff, std::little_endian>> converter;
    return converter.from_bytes(text);
#endif
}